

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O0

int IDASetMaxNumJacsIC(void *ida_mem,int maxnj)

{
  int in_ESI;
  IDAMem in_RDI;
  IDAMem IDA_mem;
  int local_4;
  
  if (in_RDI == (IDAMem)0x0) {
    IDAProcessError((IDAMem)0x0,-0x14,0x2fc,"IDASetMaxNumJacsIC",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
    local_4 = -0x14;
  }
  else if (in_ESI < 1) {
    IDAProcessError(in_RDI,-0x16,0x304,"IDASetMaxNumJacsIC",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"maxnj <= 0 illegal.");
    local_4 = -0x16;
  }
  else {
    in_RDI->ida_maxnj = in_ESI;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int IDASetMaxNumJacsIC(void* ida_mem, int maxnj)
{
  IDAMem IDA_mem;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  if (maxnj <= 0)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_MAXNJ);
    return (IDA_ILL_INPUT);
  }

  IDA_mem->ida_maxnj = maxnj;

  return (IDA_SUCCESS);
}